

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int32_t __thiscall xla::GraphCycles::NewNode(GraphCycles *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppvVar4;
  value_type pvStack_28;
  int32_t r;
  Node local_20;
  Node n;
  GraphCycles *this_local;
  
  n = (Node)this;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->rep_->free_nodes_);
  if (bVar1) {
    local_20.visited = false;
    sVar2 = std::
            vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
            ::size(&this->rep_->nodes_);
    local_20.rank = (int32_t)sVar2;
    std::vector<xla::(anonymous_namespace)::Node,std::allocator<xla::(anonymous_namespace)::Node>>::
    emplace_back<xla::(anonymous_namespace)::Node&>
              ((vector<xla::(anonymous_namespace)::Node,std::allocator<xla::(anonymous_namespace)::Node>>
                *)this->rep_,&local_20);
    std::
    vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
    ::emplace_back<>(&this->rep_->node_io_);
    pvStack_28 = (value_type)0x0;
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->rep_->node_data_,&stack0xffffffffffffffd8);
    this_local._4_4_ = local_20.rank;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->rep_->free_nodes_);
    this_local._4_4_ = *pvVar3;
    std::vector<int,_std::allocator<int>_>::pop_back(&this->rep_->free_nodes_);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->rep_->node_data_,(long)this_local._4_4_);
    *ppvVar4 = (value_type)0x0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t GraphCycles::NewNode() {
  if (rep_->free_nodes_.empty()) {
    Node n;
    n.visited = false;
    n.rank = static_cast<int32_t>(rep_->nodes_.size());
    rep_->nodes_.emplace_back(n);
    rep_->node_io_.emplace_back();
    rep_->node_data_.push_back(nullptr);
    return n.rank;
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    rep_->node_data_[r] = nullptr;
    return r;
  }
}